

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::QToolBar(QToolBar *this,QWidget *parent)

{
  long lVar1;
  QToolBarPrivate *this_00;
  QToolBarPrivate *this_01;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QToolBarPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QToolBarPrivate *)operator_new(0x290);
  QToolBarPrivate::QToolBarPrivate(this_00);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x6ec3ed);
  QWidget::QWidget(in_RDI,in_RSI,(QWidget *)this_00,(WindowFlags)f.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1e9b8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QToolBar_00d1eb70;
  this_01 = d_func((QToolBar *)0x6ec42a);
  QToolBarPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBar::QToolBar(QWidget *parent)
    : QWidget(*new QToolBarPrivate, parent, { })
{
    Q_D(QToolBar);
    d->init();
}